

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O1

CURLcode libcurl_generate_mime(curl_mime *mime,int *mimeno)

{
  char cVar1;
  bool bVar2;
  CURLcode CVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  char *__s1;
  uint uVar8;
  char *pcVar9;
  char *__ptr;
  curl_mimepart *pcVar10;
  int i;
  uint local_3c;
  char *local_38;
  
  easysrc_mime_count = easysrc_mime_count + 1;
  *mimeno = easysrc_mime_count;
  __ptr = (char *)0x0;
  CVar3 = easysrc_addf(&easysrc_decl,"curl_mime *mime%d;");
  if (CVar3 != CURLE_OK) goto LAB_00119314;
  __ptr = (char *)0x0;
  CVar3 = easysrc_addf(&easysrc_data,"mime%d = NULL;",(ulong)(uint)*mimeno);
  if (CVar3 != CURLE_OK) goto LAB_00119314;
  __ptr = (char *)0x0;
  CVar3 = easysrc_addf(&easysrc_code,"mime%d = curl_mime_init(hnd);",(ulong)(uint)*mimeno);
  if (CVar3 != CURLE_OK) goto LAB_00119314;
  __ptr = (char *)0x0;
  CVar3 = easysrc_addf(&easysrc_clean,"curl_mime_free(mime%d);",(ulong)(uint)*mimeno);
  if (CVar3 != CURLE_OK) goto LAB_00119314;
  CVar3 = easysrc_addf(&easysrc_clean,"mime%d = NULL;",(ulong)(uint)*mimeno);
  if (CVar3 == CURLE_OK) {
    if (mime->firstpart != (curl_mimepart *)0x0) {
      CVar3 = easysrc_addf(&easysrc_decl,"curl_mimepart *part%d;",(ulong)(uint)*mimeno);
      if (CVar3 != CURLE_OK) goto LAB_0011930f;
      pcVar10 = mime->firstpart;
      if (pcVar10 != (curl_mimepart *)0x0) {
        __ptr = (char *)0x0;
LAB_0011936c:
        CVar3 = easysrc_addf(&easysrc_code,"part%d = curl_mime_addpart(mime%d);",
                             (ulong)(uint)*mimeno);
        if (CVar3 != CURLE_OK) goto LAB_00119314;
        pcVar9 = pcVar10->filename;
        switch(pcVar10->kind) {
        case MIMEKIND_DATA:
          pcVar6 = pcVar10->data;
          lVar5 = -1;
          do {
            lVar7 = lVar5 + 1;
            lVar5 = lVar5 + 1;
          } while (pcVar6[lVar7] != '\0');
          lVar7 = pcVar10->datasize;
          if (lVar7 == lVar5) {
            lVar7 = -1;
          }
          free(__ptr);
          __ptr = c_escape(pcVar6,pcVar10->datasize);
          if (__ptr == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          if (lVar7 < 0) {
            CVar3 = easysrc_addf(&easysrc_code,
                                 "curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                                 (ulong)(uint)*mimeno,__ptr);
          }
          else {
            CVar3 = easysrc_addf(&easysrc_code,"curl_mime_data(part%d, \"%s\", %ld);",
                                 (ulong)(uint)*mimeno,__ptr,lVar7);
          }
          break;
        case MIMEKIND_FILE:
          free(__ptr);
          __ptr = c_escape(pcVar10->data,0xffffffffffffffff);
          if (__ptr == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          CVar3 = easysrc_addf(&easysrc_code,"curl_mime_filedata(part%d, \"%s\");",
                               (ulong)(uint)*mimeno,__ptr);
          if (CVar3 != CURLE_OK) goto LAB_00119314;
          if (pcVar9 != (char *)0x0) {
            pcVar6 = pcVar10->data;
            pcVar9 = pcVar10->data;
            do {
              do {
                __s1 = pcVar6;
                pcVar6 = pcVar9 + 1;
                cVar1 = *pcVar9;
                pcVar9 = pcVar6;
              } while (cVar1 == '/');
            } while ((cVar1 == '\\') || (pcVar6 = __s1, cVar1 != '\0'));
            pcVar6 = pcVar10->filename;
            if (pcVar6 == (char *)0x0) {
              pcVar9 = (char *)0x0;
            }
            else {
              iVar4 = strcmp(__s1,pcVar6);
              pcVar9 = (char *)0x0;
              if (iVar4 != 0) {
                pcVar9 = pcVar6;
              }
            }
            goto switchD_001193a6_default;
          }
          CVar3 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, NULL);",
                               (ulong)(uint)*mimeno);
          if (CVar3 != CURLE_OK) goto LAB_00119314;
          pcVar9 = (char *)0x0;
          goto switchD_001193a6_default;
        case MIMEKIND_CALLBACK:
          CVar3 = easysrc_addf(&easysrc_code,
                               "curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
                               (ulong)(uint)*mimeno);
          if (CVar3 != CURLE_OK) goto LAB_00119314;
          CVar3 = easysrc_add(&easysrc_code,
                              "                  (curl_seek_callback) fseek, NULL, stdin);");
          break;
        case MIMEKIND_MULTIPART:
          local_38 = pcVar9;
          CVar3 = libcurl_generate_mime((curl_mime *)pcVar10->arg,(int *)&local_3c);
          uVar8 = local_3c;
          if ((CVar3 != CURLE_OK) ||
             (CVar3 = easysrc_addf(&easysrc_code,"curl_mime_subparts(part%d, mime%d);",
                                   (ulong)(uint)*mimeno,(ulong)local_3c), CVar3 != CURLE_OK))
          goto LAB_00119314;
          CVar3 = easysrc_addf(&easysrc_code,"mime%d = NULL;",(ulong)uVar8);
          pcVar9 = local_38;
          break;
        default:
          goto switchD_001193a6_default;
        }
        if (CVar3 != CURLE_OK) goto LAB_00119314;
switchD_001193a6_default:
        if (pcVar10->encoder != (mime_encoder *)0x0) {
          free(__ptr);
          __ptr = c_escape(pcVar10->encoder->name,0xffffffffffffffff);
          if (__ptr == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          CVar3 = easysrc_addf(&easysrc_code,"curl_mime_encoder(part%d, \"%s\");",
                               (ulong)(uint)*mimeno,__ptr);
          if (CVar3 != CURLE_OK) goto LAB_00119314;
        }
        if (pcVar9 != (char *)0x0) {
          free(__ptr);
          __ptr = c_escape(pcVar9,0xffffffffffffffff);
          if (__ptr == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          CVar3 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, \"%s\");",
                               (ulong)(uint)*mimeno,__ptr);
          if (CVar3 != CURLE_OK) goto LAB_00119314;
        }
        if (pcVar10->name != (char *)0x0) {
          free(__ptr);
          __ptr = c_escape(pcVar10->name,0xffffffffffffffff);
          if (__ptr == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          CVar3 = easysrc_addf(&easysrc_code,"curl_mime_name(part%d, \"%s\");",(ulong)(uint)*mimeno,
                               __ptr);
          if (CVar3 != CURLE_OK) goto LAB_00119314;
        }
        if (pcVar10->mimetype != (char *)0x0) {
          free(__ptr);
          __ptr = c_escape(pcVar10->mimetype,0xffffffffffffffff);
          if (__ptr == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          CVar3 = easysrc_addf(&easysrc_code,"curl_mime_type(part%d, \"%s\");",(ulong)(uint)*mimeno,
                               __ptr);
          if (CVar3 != CURLE_OK) goto LAB_00119314;
        }
        if (pcVar10->userheaders == (curl_slist *)0x0) {
          CVar3 = CURLE_OK;
        }
        else {
          uVar8 = pcVar10->flags;
          CVar3 = libcurl_generate_slist(pcVar10->userheaders,(int *)&local_3c);
          if (CVar3 == CURLE_OK) {
            uVar8 = uVar8 & 1;
            local_38 = (char *)CONCAT44(local_38._4_4_,local_3c);
            CVar3 = easysrc_addf(&easysrc_code,"curl_mime_headers(part%d, slist%d, %d);",
                                 (ulong)(uint)*mimeno,(ulong)local_3c,(ulong)uVar8);
            if ((CVar3 == CURLE_OK) &&
               ((uVar8 == 0 ||
                (CVar3 = easysrc_addf(&easysrc_code,"slist%d = NULL;",(ulong)local_38 & 0xffffffff),
                CVar3 == CURLE_OK)))) {
              bVar2 = true;
              CVar3 = CURLE_OK;
            }
            else {
              bVar2 = false;
            }
          }
          else {
            bVar2 = false;
          }
          if (!bVar2) goto LAB_00119314;
        }
        pcVar10 = pcVar10->nextpart;
        if (pcVar10 == (curl_mimepart *)0x0) goto LAB_00119314;
        goto LAB_0011936c;
      }
    }
    CVar3 = CURLE_OK;
    __ptr = (char *)0x0;
  }
  else {
LAB_0011930f:
    __ptr = (char *)0x0;
  }
LAB_00119314:
  free(__ptr);
  return CVar3;
}

Assistant:

static CURLcode libcurl_generate_mime(curl_mime *mime, int *mimeno)
{
  CURLcode ret = CURLE_OK;
  int i;
  curl_off_t size;
  curl_mimepart *part;
  char *filename;
  char *escaped = NULL;
  char *cp;
  char *data;

  /* May need several mime variables, so invent name */
  *mimeno = ++easysrc_mime_count;

  DECL1("curl_mime *mime%d;", *mimeno);
  DATA1("mime%d = NULL;", *mimeno);
  CODE1("mime%d = curl_mime_init(hnd);", *mimeno);
  CLEAN1("curl_mime_free(mime%d);", *mimeno);
  CLEAN1("mime%d = NULL;", *mimeno);
  if(mime->firstpart) {
    DECL1("curl_mimepart *part%d;", *mimeno);
    for(part = mime->firstpart; part; part = part->nextpart) {
      CODE2("part%d = curl_mime_addpart(mime%d);", *mimeno, *mimeno);
      filename = part->filename;
      switch(part->kind) {
      case MIMEKIND_FILE:
        Curl_safefree(escaped);
        escaped = c_escape(part->data, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_filedata(part%d, \"%s\");", *mimeno, escaped);
        if(!filename)
          CODE1("curl_mime_filename(part%d, NULL);", *mimeno);
        else {
          /* Fast check to see if remote file name is base name. */
          filename = part->data;
          for(cp = filename; *cp; cp++)
            if(*cp == '/' || *cp == '\\')
              filename = cp + 1;
          if(!part->filename || !strcmp(filename, part->filename))
            filename = NULL;
          else
            filename = part->filename;
        }
        break;
      case MIMEKIND_CALLBACK:
        /* Can only be reading stdin in the current context. */
        CODE1("curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
              *mimeno);
        CODE0("                  (curl_seek_callback) fseek, NULL, stdin);");
        break;
      case MIMEKIND_DATA:
#ifdef CURL_DOES_CONVERSIONS
          /* Data is stored in ASCII and we want in in the host character
             code. Convert it back for output. */
          data = malloc(part->datasize + 1);
          if(!data) {
            ret = CURLE_OUT_OF_MEMORY;
            goto nomem;
          }
          memcpy(data, part->data, part->datasize + 1);
          ret = convert_from_network(data, strlen(data));
          if(ret) {
            Curl_safefree(data);
            goto nomem;
          }
#else
        data = part->data;
#endif

        /* Are there any nul byte in data? */
        for(cp = data; *cp; cp++)
          ;
        size = (cp == data + part->datasize)? (curl_off_t) -1: part->datasize;
        Curl_safefree(escaped);
        escaped = c_escape(data, (size_t) part->datasize);
#ifdef CURL_DOES_CONVERSIONS
        Curl_safefree(data);
#endif
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        if(size >= 0)
          CODE3("curl_mime_data(part%d, \"%s\", %" CURL_FORMAT_CURL_OFF_T ");",
                                *mimeno, escaped, size);
        else
          CODE2("curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                                *mimeno, escaped);
        break;
      case MIMEKIND_MULTIPART:
        ret = libcurl_generate_mime(part->arg, &i);
        if(ret)
          goto nomem;
        CODE2("curl_mime_subparts(part%d, mime%d);", *mimeno, i);
        CODE1("mime%d = NULL;", i);   /* Avoid freeing in CLEAN sequence. */
        break;
      default:
        /* Other cases not possible in this context. */
        break;
      }

      if(part->encoder) {
        Curl_safefree(escaped);
        escaped = c_escape(part->encoder->name, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_encoder(part%d, \"%s\");", *mimeno, escaped);
      }

      if(filename) {
        Curl_safefree(escaped);
        escaped = c_escape(filename, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_filename(part%d, \"%s\");", *mimeno, escaped);
      }

      if(part->name) {
        Curl_safefree(escaped);
        escaped = c_escape(part->name, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_name(part%d, \"%s\");", *mimeno, escaped);
      }

      if(part->mimetype) {
        Curl_safefree(escaped);
        escaped = c_escape(part->mimetype, CURL_ZERO_TERMINATED);
        if(!escaped)
          return CURLE_OUT_OF_MEMORY;
        CODE2("curl_mime_type(part%d, \"%s\");", *mimeno, escaped);
      }

      if(part->userheaders) {
        int ownership = part->flags & MIME_USERHEADERS_OWNER? 1: 0;

        ret = libcurl_generate_slist(part->userheaders, &i);
        if(ret)
          goto nomem;
        CODE3("curl_mime_headers(part%d, slist%d, %d);",
              *mimeno, i, ownership);
        if(ownership)
          CODE1("slist%d = NULL;", i); /* Prevent freeing in CLEAN sequence. */
      }
    }
  }

nomem:
  Curl_safefree(escaped);
  return ret;
}